

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationUserDefinedIO.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::(anonymous_namespace)::IOBlock::basicSubobjectAtIndex_abi_cxx11_
          (string *__return_storage_ptr__,void *this,int subobjectIndex,int arraySize)

{
  pointer type_;
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  TypeComponentVector *path_;
  allocator<char> local_159;
  TypeAccessFormat local_158;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_88;
  SubTypeIterator<glu::IsBasicType> local_78;
  undefined1 local_58 [8];
  BasicTypeIterator basicIt;
  VarType *membType;
  int local_28;
  int memberNdx;
  int arrayNdx;
  int currentIndex;
  int arraySize_local;
  int subobjectIndex_local;
  IOBlock *this_local;
  
  memberNdx = 0;
  local_28 = 0;
  arrayNdx = arraySize;
  currentIndex = subobjectIndex;
  _arraySize_local = this;
  this_local = (IOBlock *)__return_storage_ptr__;
  do {
    if (arrayNdx <= local_28) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,(char *)0x0,&local_159);
      std::allocator<char>::~allocator(&local_159);
      return __return_storage_ptr__;
    }
    for (membType._4_4_ = 0;
        sVar2 = std::
                vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                ::size((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                        *)((long)this + 0x48)), membType._4_4_ < (int)sVar2;
        membType._4_4_ = membType._4_4_ + 1) {
      pvVar3 = std::
               vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
               ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                             *)((long)this + 0x48),(long)membType._4_4_);
      basicIt.m_path.
      super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&pvVar3->type;
      glu::SubTypeIterator<glu::IsBasicType>::begin
                ((SubTypeIterator<glu::IsBasicType> *)local_58,
                 (VarType *)
                 basicIt.m_path.
                 super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      while( true ) {
        glu::SubTypeIterator<glu::IsBasicType>::end
                  (&local_78,
                   (VarType *)
                   basicIt.m_path.
                   super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = glu::SubTypeIterator<glu::IsBasicType>::operator!=
                          ((SubTypeIterator<glu::IsBasicType> *)local_58,&local_78);
        glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator(&local_78);
        if (!bVar1) break;
        if (memberNdx == currentIndex) {
          std::operator+(&local_108,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)this + 0x28),"[");
          de::toString<int>(&local_128,&local_28);
          std::operator+(&local_e8,&local_108,&local_128);
          std::operator+(&local_c8,&local_e8,"].");
          pvVar3 = std::
                   vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                   ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::IOBlock::Member,_std::allocator<vkt::tessellation::(anonymous_namespace)::IOBlock::Member>_>
                                 *)((long)this + 0x48),(long)membType._4_4_);
          std::operator+(&local_a8,&local_c8,&pvVar3->name);
          type_ = basicIt.m_path.
                  super__Vector_base<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
          path_ = glu::SubTypeIterator<glu::IsBasicType>::getPath
                            ((SubTypeIterator<glu::IsBasicType> *)local_58);
          glu::TypeAccessFormat::TypeAccessFormat(&local_158,(VarType *)type_,path_);
          de::toString<glu::TypeAccessFormat>(&local_148,&local_158);
          std::operator+(__return_storage_ptr__,&local_a8,&local_148);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_a8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_108);
          local_88 = 1;
          goto LAB_00e20bbf;
        }
        memberNdx = memberNdx + 1;
        glu::SubTypeIterator<glu::IsBasicType>::operator++
                  ((SubTypeIterator<glu::IsBasicType> *)local_58);
      }
      local_88 = 8;
LAB_00e20bbf:
      glu::SubTypeIterator<glu::IsBasicType>::~SubTypeIterator
                ((SubTypeIterator<glu::IsBasicType> *)local_58);
      if (local_88 == 1) {
        return __return_storage_ptr__;
      }
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

std::string IOBlock::basicSubobjectAtIndex (const int subobjectIndex, const int arraySize) const
{
	int currentIndex = 0;
	for (int arrayNdx = 0; arrayNdx < arraySize; ++arrayNdx)
	for (int memberNdx = 0; memberNdx < static_cast<int>(m_members.size()); ++memberNdx)
	{
		const glu::VarType& membType = m_members[memberNdx].type;
		for (glu::BasicTypeIterator basicIt = glu::BasicTypeIterator::begin(&membType); basicIt != glu::BasicTypeIterator::end(&membType); ++basicIt)
		{
			if (currentIndex == subobjectIndex)
				return m_interfaceName + "[" + de::toString(arrayNdx) + "]." + m_members[memberNdx].name + de::toString(glu::TypeAccessFormat(membType, basicIt.getPath()));
			currentIndex++;
		}
	}
	DE_ASSERT(false);
	return DE_NULL;
}